

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O3

void __thiscall
QGraphicsViewPrivate::updateRubberBand(QGraphicsViewPrivate *this,QMouseEvent *event)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  ItemSelectionMode mode;
  ItemSelectionOperation selectionOperation;
  undefined4 uVar9;
  QAbstractScrollArea *this_00;
  undefined4 uVar11;
  Data *pDVar10;
  undefined1 auVar12 [16];
  ulong uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  qreal qVar18;
  bool bVar19;
  ViewportUpdateMode VVar20;
  ViewportUpdateMode extraout_EAX;
  undefined4 uVar21;
  QWidget *pQVar22;
  QWidget *rect;
  QPoint QVar23;
  QWidget *pQVar24;
  undefined4 in_ECX;
  QMetaObject *widget;
  QObject *this_01;
  long in_FS_OFFSET;
  int iVar25;
  int iVar28;
  double extraout_XMM0_Qa;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  int iVar29;
  int iVar30;
  double extraout_XMM1_Qa;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  QPainterPath selectionArea;
  int local_c8;
  int iStack_c4;
  int iStack_c0;
  int iStack_bc;
  qreal local_b8;
  qreal qStack_b0;
  qreal local_a8;
  qreal qStack_a0;
  QPointF local_98;
  undefined1 local_88 [16];
  qreal *local_78;
  qreal *local_70;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->dragMode != RubberBandDrag) || ((this->field_0x300 & 1) == 0)) ||
     (this->rubberBanding != true)) goto LAB_0062e002;
  this_00 = *(QAbstractScrollArea **)
             &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
              field_0x8;
  pQVar24 = (QWidget *)event;
  auVar36 = QEventPoint::position();
  auVar32._0_8_ =
       (double)((ulong)auVar36._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar36._0_8_;
  auVar32._8_8_ =
       (double)((ulong)auVar36._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar36._8_8_;
  auVar36 = maxpd(auVar32,_DAT_006605e0);
  iVar29 = (this->mousePressViewPoint).xp.m_i -
           (int)(double)(~-(ulong)(2147483647.0 < auVar32._0_8_) & auVar36._0_8_ |
                        -(ulong)(2147483647.0 < auVar32._0_8_) & 0x41dfffffffc00000);
  iVar30 = (this->mousePressViewPoint).yp.m_i -
           (int)(double)(~-(ulong)(2147483647.0 < auVar32._8_8_) & auVar36._8_8_ |
                        -(ulong)(2147483647.0 < auVar32._8_8_) & 0x41dfffffffc00000);
  iVar25 = iVar29 >> 0x1f;
  iVar28 = iVar30 >> 0x1f;
  uVar13 = CONCAT44(iVar30,iVar29) ^ CONCAT44(iVar28,iVar25);
  iVar29 = QApplication::startDragDistance();
  if (((int)(uVar13 >> 0x20) - iVar28) + ((int)uVar13 - iVar25) < iVar29) goto LAB_0062e002;
  VVar20 = this->viewportUpdateMode;
  if ((VVar20 != NoViewportUpdate) &&
     (uVar1 = (this->rubberBandRect).x1, uVar5 = (this->rubberBandRect).y1,
     uVar2 = (this->rubberBandRect).x2, uVar6 = (this->rubberBandRect).y2,
     auVar36._0_4_ = -(uint)((int)uVar2 < (int)uVar1), auVar36._4_4_ = auVar36._0_4_,
     auVar36._8_4_ = -(uint)((int)uVar6 < (int)uVar5),
     auVar36._12_4_ = -(uint)((int)uVar6 < (int)uVar5), iVar29 = movmskpd(in_ECX,auVar36),
     iVar29 == 0)) {
    if (VVar20 == FullViewportUpdate) {
      updateAll(this);
      VVar20 = extraout_EAX;
    }
    else {
      pQVar22 = QAbstractScrollArea::viewport(this_00);
      rect = QAbstractScrollArea::viewport(this_00);
      rubberBandRegion((QGraphicsViewPrivate *)local_88,pQVar24,(QRect *)rect);
      QWidget::update(pQVar22,(QRegion *)local_88);
      VVar20 = QRegion::~QRegion((QRegion *)local_88);
    }
  }
  if (*(int *)(event + 0x44) == 0) {
    this->rubberBanding = false;
    this->rubberBandSelectionOperation = ReplaceSelection;
    uVar3 = (this->rubberBandRect).x1;
    uVar7 = (this->rubberBandRect).y1;
    uVar4 = (this->rubberBandRect).x2;
    uVar8 = (this->rubberBandRect).y2;
    auVar27._0_4_ = -(uint)(uVar4 == uVar3 + -1);
    iVar29 = -(uint)(uVar8 == uVar7 + -1);
    auVar27._4_4_ = auVar27._0_4_;
    auVar27._8_4_ = iVar29;
    auVar27._12_4_ = iVar29;
    iVar29 = movmskpd(VVar20,auVar27);
    if (iVar29 != 3) {
      (this->rubberBandRect).x1 = 0;
      (this->rubberBandRect).y1 = 0;
      (this->rubberBandRect).x2 = -1;
      (this->rubberBandRect).y2 = -1;
      uVar9 = (this->rubberBandRect).x2;
      uVar11 = (this->rubberBandRect).y2;
      auVar12._4_4_ = uVar11;
      auVar12._0_4_ = uVar9;
      auVar12._8_8_ = 0;
      QGraphicsView::rubberBandChanged
                ((QGraphicsView *)this_00,(QRect)(auVar12 << 0x40),(QPointF)ZEXT816(0),
                 (QPointF)(ZEXT816(0) << 0x40));
    }
    goto LAB_0062e002;
  }
  uVar14 = (this->rubberBandRect).x1;
  uVar15 = (this->rubberBandRect).y1;
  uVar16 = (this->rubberBandRect).x2;
  uVar17 = (this->rubberBandRect).y2;
  QVar23 = QGraphicsView::mapFromScene((QGraphicsView *)this_00,&this->mousePressScenePoint);
  uVar21 = QEventPoint::position();
  auVar31._0_8_ =
       (double)((ulong)extraout_XMM0_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
       extraout_XMM0_Qa;
  auVar31._8_8_ =
       (double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
       extraout_XMM1_Qa;
  auVar32 = maxpd(auVar31,_DAT_006605e0);
  auVar26._0_4_ =
       (int)(double)(~-(ulong)(2147483647.0 < auVar31._0_8_) & auVar32._0_8_ |
                    -(ulong)(2147483647.0 < auVar31._0_8_) & 0x41dfffffffc00000);
  auVar26._4_4_ =
       (int)(double)(~-(ulong)(2147483647.0 < auVar31._8_8_) & auVar32._8_8_ |
                    -(ulong)(2147483647.0 < auVar31._8_8_) & 0x41dfffffffc00000);
  auVar26._8_8_ = 0;
  auVar33._0_8_ =
       CONCAT44(-(uint)(QVar23.yp.m_i.m_i < auVar26._4_4_),
                -(uint)(QVar23.xp.m_i.m_i < auVar26._0_4_));
  auVar33._8_8_ = 0;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = (ulong)QVar23 & auVar33._0_8_;
  auVar35 = ~auVar33 & auVar26 | auVar35;
  iVar28 = QVar23.xp.m_i.m_i - auVar26._0_4_;
  iVar30 = QVar23.yp.m_i.m_i - auVar26._4_4_;
  iVar29 = iVar28 >> 0x1f;
  iVar25 = iVar30 >> 0x1f;
  uVar13 = CONCAT44(iVar30,iVar28) ^ CONCAT44(iVar25,iVar29);
  iVar29 = ((int)uVar13 - iVar29) + auVar35._0_4_;
  iVar25 = ((int)(uVar13 >> 0x20) - iVar25) + auVar35._4_4_;
  (this->rubberBandRect).x1 = (Representation)(int)auVar35._0_8_;
  (this->rubberBandRect).y1 = (Representation)(int)((ulong)auVar35._0_8_ >> 0x20);
  (this->rubberBandRect).x2 = (Representation)iVar29;
  (this->rubberBandRect).y2 = (Representation)iVar25;
  auVar34._0_4_ = -(uint)(auVar35._0_4_ == uVar14);
  auVar34._4_4_ = -(uint)(auVar35._4_4_ == uVar15);
  auVar34._8_4_ = -(uint)(iVar29 == uVar16);
  auVar34._12_4_ = -(uint)(iVar25 == uVar17);
  iVar29 = movmskps(uVar21,auVar34);
  if (iVar29 == 0xf) {
    widget = (QMetaObject *)&this->lastMouseMoveScenePoint;
    bVar19 = qFuzzyCompare(&this->lastRubberbandScenePoint,(QPointF *)widget);
    if (!bVar19) goto LAB_0062dde3;
  }
  else {
LAB_0062dde3:
    qVar18 = (this->lastMouseMoveScenePoint).yp;
    (this->lastRubberbandScenePoint).xp = (this->lastMouseMoveScenePoint).xp;
    (this->lastRubberbandScenePoint).yp = qVar18;
    local_98.xp = *(qreal *)&this->rubberBandRect;
    local_98.yp = *(qreal *)&(this->rubberBandRect).x2;
    local_88._8_8_ = &local_98;
    local_a8 = (this->mousePressScenePoint).xp;
    qStack_a0 = (this->mousePressScenePoint).yp;
    local_78 = &local_a8;
    local_b8 = (this->lastRubberbandScenePoint).xp;
    qStack_b0 = (this->lastRubberbandScenePoint).yp;
    local_70 = &local_b8;
    local_88._0_8_ = (QArrayData *)0x0;
    widget = &QGraphicsView::staticMetaObject;
    QMetaObject::activate((QObject *)this_00,&QGraphicsView::staticMetaObject,0,(void **)local_88);
  }
  if (this->viewportUpdateMode == FullViewportUpdate) {
    updateAll(this);
  }
  else if (this->viewportUpdateMode != NoViewportUpdate) {
    pQVar24 = QAbstractScrollArea::viewport(this_00);
    pQVar22 = QAbstractScrollArea::viewport(this_00);
    rubberBandRegion((QGraphicsViewPrivate *)local_88,(QWidget *)widget,(QRect *)pQVar22);
    QWidget::update(pQVar24,(QRegion *)local_88);
    QRegion::~QRegion((QRegion *)local_88);
  }
  local_98.xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
  QPainterPath::QPainterPath((QPainterPath *)&local_98);
  QGraphicsView::mapToScene((QPolygonF *)local_88,(QGraphicsView *)this_00,&this->rubberBandRect);
  QPainterPath::addPolygon((QPolygonF *)&local_98);
  if ((QArrayData *)local_88._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_88._0_8_,0x10,0x10);
    }
  }
  QPainterPath::closeSubpath();
  pDVar10 = (this->scene).wp.d;
  if ((pDVar10 != (Data *)0x0) &&
     (this_01 = (this->scene).wp.value, this_01 != (QObject *)0x0 && *(int *)(pDVar10 + 4) != 0)) {
    if (*(int *)(pDVar10 + 4) == 0) {
      this_01 = (QObject *)(QGraphicsScene *)0x0;
    }
    mode = this->rubberBandSelectionMode;
    selectionOperation = this->rubberBandSelectionOperation;
    QGraphicsView::viewportTransform((QTransform *)local_88,(QGraphicsView *)this_00);
    QGraphicsScene::setSelectionArea
              ((QGraphicsScene *)this_01,(QPainterPath *)&local_98,selectionOperation,mode,
               (QTransform *)local_88);
  }
  QPainterPath::~QPainterPath((QPainterPath *)&local_98);
LAB_0062e002:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsViewPrivate::updateRubberBand(const QMouseEvent *event)
{
    Q_Q(QGraphicsView);
    if (dragMode != QGraphicsView::RubberBandDrag || !sceneInteractionAllowed || !rubberBanding)
        return;
    // Check for enough drag distance
    if ((mousePressViewPoint - event->position().toPoint()).manhattanLength() < QApplication::startDragDistance())
        return;

    // Update old rubberband
    if (viewportUpdateMode != QGraphicsView::NoViewportUpdate && !rubberBandRect.isEmpty()) {
        if (viewportUpdateMode != QGraphicsView::FullViewportUpdate)
            q->viewport()->update(rubberBandRegion(q->viewport(), rubberBandRect));
        else
            updateAll();
    }

    // Stop rubber banding if the user has let go of all buttons (even
    // if we didn't get the release events).
    if (!event->buttons()) {
        rubberBanding = false;
        rubberBandSelectionOperation = Qt::ReplaceSelection;
        if (!rubberBandRect.isNull()) {
            rubberBandRect = QRect();
            emit q->rubberBandChanged(rubberBandRect, QPointF(), QPointF());
        }
        return;
    }

    QRect oldRubberband = rubberBandRect;

    // Update rubberband position
    const QPoint mp = q->mapFromScene(mousePressScenePoint);
    const QPoint ep = event->position().toPoint();
    rubberBandRect = QRect(qMin(mp.x(), ep.x()), qMin(mp.y(), ep.y()),
                           qAbs(mp.x() - ep.x()) + 1, qAbs(mp.y() - ep.y()) + 1);

    if (rubberBandRect != oldRubberband || lastRubberbandScenePoint != lastMouseMoveScenePoint) {
        lastRubberbandScenePoint = lastMouseMoveScenePoint;
        oldRubberband = rubberBandRect;
        emit q->rubberBandChanged(rubberBandRect, mousePressScenePoint, lastRubberbandScenePoint);
    }

    // Update new rubberband
    if (viewportUpdateMode != QGraphicsView::NoViewportUpdate) {
        if (viewportUpdateMode != QGraphicsView::FullViewportUpdate)
            q->viewport()->update(rubberBandRegion(q->viewport(), rubberBandRect));
        else
            updateAll();
    }
            // Set the new selection area
    QPainterPath selectionArea;
    selectionArea.addPolygon(q->mapToScene(rubberBandRect));
    selectionArea.closeSubpath();
    if (scene)
        scene->setSelectionArea(selectionArea, rubberBandSelectionOperation, rubberBandSelectionMode, q->viewportTransform());
}